

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O2

void ggml_backend_tensor_copy_async
               (ggml_backend_t backend_src,ggml_backend_t backend_dst,ggml_tensor *src,
               ggml_tensor *dst)

{
  _func__Bool_ggml_backend_t_ggml_backend_t_ggml_tensor_ptr_ggml_tensor_ptr *p_Var1;
  _func_void_ggml_backend_t *p_Var2;
  _Bool _Var3;
  
  _Var3 = ggml_are_same_layout(src,dst);
  if (!_Var3) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-backend.cpp"
               ,0x18a,"GGML_ASSERT(%s) failed",
               "ggml_are_same_layout(src, dst) && \"cannot copy tensors with different layouts\"");
  }
  if (src == dst) {
    return;
  }
  p_Var1 = (backend_dst->iface).cpy_tensor_async;
  if ((p_Var1 != (_func__Bool_ggml_backend_t_ggml_backend_t_ggml_tensor_ptr_ggml_tensor_ptr *)0x0)
     && (_Var3 = (*p_Var1)(backend_src,backend_dst,src,dst), _Var3)) {
    return;
  }
  p_Var2 = (backend_src->iface).synchronize;
  if (p_Var2 != (_func_void_ggml_backend_t *)0x0) {
    (*p_Var2)(backend_src);
  }
  p_Var2 = (backend_dst->iface).synchronize;
  if (p_Var2 != (_func_void_ggml_backend_t *)0x0) {
    (*p_Var2)(backend_dst);
  }
  ggml_backend_tensor_copy(src,dst);
  return;
}

Assistant:

void ggml_backend_tensor_copy_async(ggml_backend_t backend_src, ggml_backend_t backend_dst, struct ggml_tensor * src, struct ggml_tensor * dst) {
    GGML_ASSERT(ggml_are_same_layout(src, dst) && "cannot copy tensors with different layouts");

    if (src == dst) {
        return;
    }

    if (backend_dst->iface.cpy_tensor_async != NULL) {
        if (backend_dst->iface.cpy_tensor_async(backend_src, backend_dst, src, dst)) {
            return;
        }
    }

    // an async copy would normally happen after all the queued operations on both backends are completed
    // to simulate the same behavior, we need to synchronize both backends first, and do a blocking copy
    ggml_backend_synchronize(backend_src);
    ggml_backend_synchronize(backend_dst);
    ggml_backend_tensor_copy(src, dst);
}